

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

void __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::allocate
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this)

{
  Task *pTVar1;
  __atomic_flag_data_type _Var2;
  int iVar3;
  int iVar4;
  Task *pTVar5;
  Task *last_datain;
  Task *h;
  
  iVar3 = this->chunkSize_;
  iVar4 = this->minTSize_;
  h = (Task *)malloc((long)(iVar4 * iVar3));
  last_datain = (Task *)((h->func_).super__Function_base._M_functor._M_pod_data +
                        (iVar3 + -1) * iVar4);
  pTVar5 = h;
  do {
    pTVar1 = (Task *)((pTVar5->func_).super__Function_base._M_functor._M_pod_data + iVar4);
    pTVar5->next = pTVar1;
    pTVar5 = pTVar1;
  } while (pTVar1 <= last_datain);
  do {
    LOCK();
    _Var2 = (this->pool_mutex_).super___atomic_flag_base._M_i;
    (this->pool_mutex_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var2 != false);
  std::
  vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
  ::push_back(&this->v_,&h);
  freeLinkedList(this,h,last_datain,true);
  (this->pool_mutex_).super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }